

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

FlagBase * __thiscall args::FlagBase::Match(FlagBase *this,EitherFlag *flag)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this_00;
  ostringstream problem;
  string local_1b8;
  ostringstream local_198 [376];
  
  bVar1 = Matcher::Match(&this->matcher,flag);
  if (bVar1) {
    if ((((this->super_NamedBase).super_Base.options & Single) != None) &&
       ((this->super_NamedBase).super_Base.matched == true)) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Flag \'",6);
      EitherFlag::str_abi_cxx11_(&local_1b8,flag);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"\' was passed multiple times, but is only allowed to be passed once",0x42);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,(string *)&local_1b8);
      *(undefined ***)this_00 = &PTR__runtime_error_001228a8;
      __cxa_throw(this_00,&ExtraError::typeinfo,std::runtime_error::~runtime_error);
    }
    (this->super_NamedBase).super_Base.matched = true;
  }
  else {
    this = (FlagBase *)0x0;
  }
  return this;
}

Assistant:

virtual FlagBase *Match(const EitherFlag &flag) override
            {
                if (matcher.Match(flag))
                {
                    if ((GetOptions() & Options::Single) != Options::None && matched)
                    {
                        std::ostringstream problem;
                        problem << "Flag '" << flag.str() << "' was passed multiple times, but is only allowed to be passed once";
#ifdef ARGS_NOEXCEPT
                        error = Error::Extra;
                        errorMsg = problem.str();
#else
                        throw ExtraError(problem.str());
#endif
                    }
                    matched = true;
                    return this;
                }
                return nullptr;
            }